

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->current_size_;
  if (iVar1 == this->total_size_) {
    Reserve(this,iVar1 + 1);
    this->allocated_size_ = this->allocated_size_ + 1;
  }
  else {
    iVar2 = this->allocated_size_;
    if (iVar2 == this->total_size_) {
      if ((long *)this->elements_[iVar1] != (long *)0x0) {
        (**(code **)(*this->elements_[iVar1] + 8))();
      }
    }
    else if (iVar1 < iVar2) {
      this->elements_[iVar2] = this->elements_[iVar1];
      this->allocated_size_ = iVar2 + 1;
    }
    else {
      this->allocated_size_ = iVar2 + 1;
    }
  }
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->elements_[iVar1] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++allocated_size_;
  } else if (allocated_size_ == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(cast<TypeHandler>(elements_[current_size_]));
  } else if (current_size_ < allocated_size_) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    elements_[allocated_size_] = elements_[current_size_];
    ++allocated_size_;
  } else {
    // There are no cleared objects.
    ++allocated_size_;
  }

  elements_[current_size_++] = value;
}